

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void __thiscall CVmObjString::CVmObjString(CVmObjString *this,size_t len)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  char *in_RSI;
  CVmObject *in_RDI;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0042aa18;
  if ((char *)0xffff < in_RSI) {
    in_RDI->ext_ = (char *)0x0;
    err_throw(0);
  }
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,in_RSI + 2,in_RDI);
  in_RDI->ext_ = (char *)CONCAT44(extraout_var,iVar1);
  vmb_put_len(in_RSI,(size_t)in_RDI);
  return;
}

Assistant:

CVmObjString::CVmObjString(VMG_ size_t len)
{
    /* 
     *   the length is limited to an unsigned 16-bit value (NB: it really is
     *   65535 on ALL PLATFORMS - this is a portable limit imposed by the
     *   portable storage format, not a local platform limit) 
     */
    if (len > 65535)
    {
        ext_ = 0;
        err_throw(VMERR_STR_TOO_LONG);
    }
    
    /* 
     *   allocate space for the buffer plus the length prefix in the
     *   variable heap 
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* set the length */
    vmb_put_len(ext_, len);
}